

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O2

void __thiscall
ListNodes<std::shared_ptr<Array>_>::~ListNodes(ListNodes<std::shared_ptr<Array>_> *this)

{
  __shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2> *)this,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->theItem).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->theItem).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->theNext).
              super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

ListNodes<T>::~ListNodes() {
    theNext = nullptr;
    theItem = nullptr;
}